

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void __thiscall
mp::ExprWrapper<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::ExprWrapper
          (ExprWrapper<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_> *this,
          AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *c)

{
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_RSI;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_ffffffffffffffe8;
  
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ExprWrapper(Con c) : con_flat_(std::move(c)) { }